

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReader::~PtexReader(PtexReader *this)

{
  Level *this_00;
  pointer ppLVar1;
  
  (this->super_PtexTexture)._vptr_PtexTexture = (_func_int **)&PTR__PtexReader_02d1b5d8;
  closeFP(this);
  if (this->_constdata != (uint8_t *)0x0) {
    operator_delete__(this->_constdata);
  }
  if (this->_metadata != (MetaData *)0x0) {
    (*(this->_metadata->super_PtexMetaData)._vptr_PtexMetaData[1])();
  }
  for (ppLVar1 = (this->_levels).
                 super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar1 !=
      (this->_levels).
      super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppLVar1 = ppLVar1 + 1) {
    this_00 = *ppLVar1;
    if (this_00 != (Level *)0x0) {
      Level::~Level(this_00);
      operator_delete(this_00,0x48);
    }
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->_errorPixel).super__Vector_base<char,_std::allocator<char>_>);
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
  ~PtexHashMap(&this->_reductions);
  std::
  _Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
  ::~_Vector_base(&(this->_faceedits).
                   super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                 );
  std::
  _Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
  ::~_Vector_base(&(this->_metaedits).
                   super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
                 );
  std::
  _Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>::
  ~_Vector_base(&(this->_levels).
                 super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
               );
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->_levelpos).super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_>::~_Vector_base
            (&(this->_levelinfo).
              super__Vector_base<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>::~_Vector_base
            (&(this->_faceinfo).
              super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>);
  std::__cxx11::string::~string((string *)&this->_path);
  pthread_mutex_destroy((pthread_mutex_t *)&this->readlock);
  return;
}

Assistant:

PtexReader::~PtexReader()
{
    closeFP();
    if (_constdata) delete [] _constdata;
    if (_metadata) delete _metadata;

    for (std::vector<Level*>::iterator i = _levels.begin(); i != _levels.end(); ++i) {
        if (*i) delete *i;
    }
}